

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O0

bool __thiscall Js::DynamicType::ShareType(DynamicType *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  DynamicTypeHandler *pDVar5;
  ScriptContext *scriptContext;
  DynamicType *this_local;
  
  bVar2 = GetIsShared(this);
  if (bVar2) {
    pDVar5 = GetTypeHandler(this);
    iVar3 = (*pDVar5->_vptr_DynamicTypeHandler[5])();
    if (iVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                  ,0x96,"(this->GetTypeHandler()->IsSharable())",
                                  "this->GetTypeHandler()->IsSharable()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_local._7_1_ = true;
  }
  else {
    pDVar5 = GetTypeHandler(this);
    iVar3 = (*pDVar5->_vptr_DynamicTypeHandler[5])();
    if (iVar3 != 0) {
      pDVar5 = GetTypeHandler(this);
      bVar2 = DynamicTypeHandler::GetMayBecomeShared(pDVar5);
      if (bVar2) {
        LockType(this);
        pDVar5 = GetTypeHandler(this);
        scriptContext = Js::Type::GetScriptContext(&this->super_Type);
        DynamicTypeHandler::ShareTypeHandler(pDVar5,scriptContext);
        this->isShared = true;
        return true;
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DynamicType::ShareType()
    {
        if (this->GetIsShared())
        {
            Assert(this->GetTypeHandler()->IsSharable());
            return true;
        }
        if (this->GetTypeHandler()->IsSharable() && this->GetTypeHandler()->GetMayBecomeShared())
        {
            LockType();
            this->GetTypeHandler()->ShareTypeHandler(this->GetScriptContext());
            this->isShared = true;
            return true;
        }
        return false;
    }